

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O1

void __thiscall Assimp::BVHLoader::ReadMotion(BVHLoader *this,aiScene *param_1)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  pointer pNVar4;
  ulong uVar5;
  float fVar6;
  string tokenDuration1;
  string tokenDuration2;
  string tokenFrames;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  float local_1a8 [94];
  
  GetNextToken_abi_cxx11_(&local_1e8,this);
  iVar2 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Expected frame count \"Frames:\", but found \"",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
    std::__cxx11::stringbuf::str();
    ThrowException(this,&local_228);
  }
  fVar6 = GetNextTokenAsFloat(this);
  this->mAnimNumFrames = (uint)(long)fVar6;
  GetNextToken_abi_cxx11_(&local_228,this);
  GetNextToken_abi_cxx11_(&local_208,this);
  iVar2 = std::__cxx11::string::compare((char *)&local_228);
  if (iVar2 == 0) {
    iVar2 = std::__cxx11::string::compare((char *)&local_208);
    if (iVar2 == 0) {
      fVar6 = GetNextTokenAsFloat(this);
      this->mAnimTickDuration = fVar6;
      for (pNVar4 = (this->mNodes).
                    super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pNVar4 != (this->mNodes).
                    super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pNVar4 = pNVar4 + 1) {
        std::vector<float,_std::allocator<float>_>::reserve
                  (&pNVar4->mChannelValues,
                   (ulong)this->mAnimNumFrames *
                   ((long)(pNVar4->mChannels).
                          super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pNVar4->mChannels).
                          super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      if (this->mAnimNumFrames != 0) {
        uVar3 = 0;
        do {
          for (pNVar4 = (this->mNodes).
                        super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pNVar4 != (this->mNodes).
                        super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                        ._M_impl.super__Vector_impl_data._M_finish; pNVar4 = pNVar4 + 1) {
            if ((pNVar4->mChannels).
                super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (pNVar4->mChannels).
                super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar5 = 1;
              do {
                local_1a8[0] = GetNextTokenAsFloat(this);
                std::vector<float,_std::allocator<float>_>::emplace_back<float>
                          (&pNVar4->mChannelValues,local_1a8);
                bVar1 = uVar5 < (ulong)((long)(pNVar4->mChannels).
                                              super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pNVar4->mChannels).
                                              super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 2);
                uVar5 = (ulong)((int)uVar5 + 1);
              } while (bVar1);
            }
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < this->mAnimNumFrames);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Expected frame duration \"Frame Time:\", but found \"",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
  std::__cxx11::stringbuf::str();
  ThrowException(this,&local_1c8);
}

Assistant:

void BVHLoader::ReadMotion( aiScene* /*pScene*/)
{
    // Read number of frames
    std::string tokenFrames = GetNextToken();
    if( tokenFrames != "Frames:")
        ThrowException( format() << "Expected frame count \"Frames:\", but found \"" << tokenFrames << "\".");

    float numFramesFloat = GetNextTokenAsFloat();
    mAnimNumFrames = (unsigned int) numFramesFloat;

    // Read frame duration
    std::string tokenDuration1 = GetNextToken();
    std::string tokenDuration2 = GetNextToken();
    if( tokenDuration1 != "Frame" || tokenDuration2 != "Time:")
        ThrowException( format() << "Expected frame duration \"Frame Time:\", but found \"" << tokenDuration1 << " " << tokenDuration2 << "\"." );

    mAnimTickDuration = GetNextTokenAsFloat();

    // resize value vectors for each node
    for( std::vector<Node>::iterator it = mNodes.begin(); it != mNodes.end(); ++it)
        it->mChannelValues.reserve( it->mChannels.size() * mAnimNumFrames);

    // now read all the data and store it in the corresponding node's value vector
    for( unsigned int frame = 0; frame < mAnimNumFrames; ++frame)
    {
        // on each line read the values for all nodes
        for( std::vector<Node>::iterator it = mNodes.begin(); it != mNodes.end(); ++it)
        {
            // get as many values as the node has channels
            for( unsigned int c = 0; c < it->mChannels.size(); ++c)
                it->mChannelValues.push_back( GetNextTokenAsFloat());
        }

        // after one frame worth of values for all nodes there should be a newline, but we better don't rely on it
    }
}